

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O1

void clear_tracks(ROOM_INDEX_DATA *room)

{
  TRACK_DATA *pTVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    room->tracks[lVar2]->prey = (CHAR_DATA *)0x0;
    pTVar1 = room->tracks[lVar2];
    pTVar1->direction = -1;
    pTVar1->flying = false;
    pTVar1->sneaking = false;
    pTVar1->legs = -1;
    pTVar1->bleeding = false;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void clear_tracks(ROOM_INDEX_DATA *room)
{
	for (auto i = 0; i < MAX_TRACKS - 1; i++)
	{
		room->tracks[i]->prey = nullptr;
		room->tracks[i]->direction = -1;
		room->tracks[i]->flying= false;
		room->tracks[i]->sneaking= false;
		room->tracks[i]->bleeding= false;
		room->tracks[i]->legs = -1;
	}
}